

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpatexpress.cc
# Opt level: O3

void __thiscall
EquationCat::genPattern(EquationCat *this,vector<TokenPattern,_std::allocator<TokenPattern>_> *ops)

{
  TokenPattern local_38;
  
  (*this->left->_vptr_PatternEquation[2])();
  (*this->right->_vptr_PatternEquation[2])(this->right,ops);
  TokenPattern::doCat(&local_38,&this->left->resultpattern,&this->right->resultpattern);
  TokenPattern::operator=(&(this->super_PatternEquation).resultpattern,&local_38);
  if (local_38.pattern != (Pattern *)0x0) {
    (*(local_38.pattern)->_vptr_Pattern[1])();
  }
  if (local_38.toklist.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.toklist.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void EquationCat::genPattern(const vector<TokenPattern> &ops) const

{
  left->genPattern(ops);
  right->genPattern(ops);
  resultpattern = left->getTokenPattern().doCat(right->getTokenPattern());
}